

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v7::detail::report_error(format_func func,int error_code,string_view message)

{
  memory_buffer full_message;
  buffer<char> local_230;
  char local_210 [504];
  
  local_230.size_ = 0;
  local_230._vptr_buffer = (_func_int **)&PTR_grow_00129cc0;
  local_230.capacity_ = 500;
  local_230.ptr_ = local_210;
  (*func)(&local_230,error_code,message);
  fwrite(local_230.ptr_,local_230.size_,1,_stderr);
  fputc(10,_stderr);
  local_230._vptr_buffer = (_func_int **)&PTR_grow_00129cc0;
  if (local_230.ptr_ != local_210) {
    operator_delete(local_230.ptr_,local_230.capacity_);
  }
  return;
}

Assistant:

FMT_FUNC void report_error(format_func func, int error_code,
                           string_view message) FMT_NOEXCEPT {
  memory_buffer full_message;
  func(full_message, error_code, message);
  // Don't use fwrite_fully because the latter may throw.
  (void)std::fwrite(full_message.data(), full_message.size(), 1, stderr);
  std::fputc('\n', stderr);
}